

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

UnicodeSet * __thiscall icu_63::UnicodeSet::addAll(UnicodeSet *this,UnicodeSet *c)

{
  int32_t iVar1;
  UnicodeString *s;
  int index;
  UVector *this_00;
  
  if ((0 < c->len) && (c->list != (UChar32 *)0x0)) {
    add(this,c->list,c->len,'\0');
  }
  if ((c->strings != (UVector *)0x0) && (this_00 = c->strings, 0 < this_00->count)) {
    index = 0;
    do {
      s = (UnicodeString *)UVector::elementAt(this_00,index);
      iVar1 = UVector::indexOf(this->strings,s,0);
      if (iVar1 < 0) {
        _add(this,s);
      }
      index = index + 1;
      this_00 = c->strings;
    } while (index < this_00->count);
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::addAll(const UnicodeSet& c) {
    if ( c.len>0 && c.list!=NULL ) {
        add(c.list, c.len, 0);
    }

    // Add strings in order
    if ( c.strings!=NULL ) {
        for (int32_t i=0; i<c.strings->size(); ++i) {
            const UnicodeString* s = (const UnicodeString*)c.strings->elementAt(i);
            if (!strings->contains((void*) s)) {
                _add(*s);
            }
        }
    }
    return *this;
}